

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O3

int Ree_ManCountFadds(Vec_Int_t *vAdds)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = vAdds->nSize;
  if (iVar1 < 1) {
    iVar2 = 0;
  }
  else {
    iVar3 = 0;
    iVar2 = 0;
    do {
      if (iVar1 <= (int)(iVar3 + 2U)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (iVar2 + 1) - (uint)(vAdds->pArray[iVar3 + 2U] == 0);
      iVar3 = iVar3 + 6;
    } while (iVar3 < iVar1);
  }
  return iVar2;
}

Assistant:

int Ree_ManCountFadds( Vec_Int_t * vAdds )
{
    int i, Count = 0;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        if ( Vec_IntEntry(vAdds, 6*i+2) != 0 )
            Count++;
    return Count;
}